

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtcpserver.cpp
# Opt level: O2

void __thiscall QTcpServer::addPendingConnection(QTcpServer *this,QTcpSocket *socket)

{
  QList<QTcpSocket_*>::append((QList<QTcpSocket_*> *)(*(long *)&this->field_0x8 + 0x80),socket);
  pendingConnectionAvailable(this);
  return;
}

Assistant:

void QTcpServer::addPendingConnection(QTcpSocket* socket)
{
    d_func()->pendingConnections.append(socket);
    emit pendingConnectionAvailable(QPrivateSignal());
}